

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack16to4.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_transform_kernel_pack16to4_avx512
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  float *k00_2;
  int j_2;
  int i_2;
  int k_2;
  int p_2;
  float *g00_2;
  float *k00_1;
  int j_1;
  int i_1;
  int k_1;
  int p_1;
  float *g00_1;
  float *k00;
  int j;
  int i;
  int k;
  int p;
  float *g00;
  int q;
  Mat kernel;
  int maxk;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffff7b0;
  size_t in_stack_fffffffffffff7b8;
  undefined8 in_stack_fffffffffffff7c0;
  int _c;
  undefined8 in_stack_fffffffffffff7c8;
  Mat *in_stack_fffffffffffff7d0;
  Allocator *in_stack_fffffffffffff890;
  undefined8 in_stack_fffffffffffff898;
  undefined8 in_stack_fffffffffffff8a0;
  Mat *in_stack_fffffffffffff8a8;
  undefined8 local_740;
  undefined8 local_738;
  undefined4 local_718;
  undefined4 local_70c;
  undefined8 local_700;
  void *local_6f8;
  int local_6f0;
  int local_6ec;
  int local_6e8;
  int local_6e4;
  undefined8 local_6e0;
  undefined8 local_6d8;
  undefined8 local_6d0;
  undefined4 local_6c8;
  long local_6c0;
  undefined4 local_6b8;
  undefined4 local_6b4;
  undefined4 local_6b0;
  undefined4 local_6ac;
  undefined4 local_6a8;
  undefined8 local_6a0;
  undefined4 *local_698;
  undefined8 local_690;
  undefined8 local_688;
  undefined8 local_680;
  undefined4 local_678;
  long *local_670;
  undefined4 local_668;
  undefined4 local_664;
  undefined4 local_660;
  undefined4 local_65c;
  undefined4 local_658;
  undefined8 local_650;
  void *local_648;
  int local_640;
  int local_63c;
  int local_638;
  int local_634;
  undefined8 local_630;
  undefined8 local_628;
  undefined8 local_620;
  undefined4 local_618;
  long local_610;
  undefined4 local_608;
  undefined4 local_604;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  undefined8 local_5f0;
  undefined4 *local_5e8;
  undefined8 local_5e0;
  undefined8 local_5d8;
  undefined8 local_5d0;
  undefined4 local_5c8;
  long *local_5c0;
  undefined4 local_5b8;
  undefined4 local_5b4;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  undefined8 local_5a0;
  void *local_598;
  int local_590;
  int local_58c;
  int local_588;
  int local_584;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 local_570;
  undefined4 local_568;
  long local_560;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  undefined4 local_54c;
  undefined4 local_548;
  undefined8 local_540;
  undefined4 *local_538;
  int local_530;
  void *local_520;
  int *local_518;
  long local_510;
  long *local_500;
  int local_4f4;
  int local_4f0;
  long local_4e0;
  int local_4d4;
  int local_4c8;
  int local_4c4;
  long *local_4c0;
  undefined8 *local_4b0;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined8 *local_488;
  undefined8 *local_480;
  undefined8 *local_470;
  void **local_468;
  int local_448;
  undefined4 local_444;
  void **local_440;
  undefined8 *local_430;
  undefined8 *local_410;
  undefined8 *local_400;
  undefined8 *local_3e0;
  undefined8 *local_3d0;
  undefined8 *local_3b0;
  undefined1 local_3a5;
  int local_3a4;
  void **local_3a0;
  undefined8 *local_398;
  undefined1 local_375;
  int local_374;
  undefined8 *local_368;
  undefined1 local_345;
  int local_344;
  void **local_340;
  undefined8 *local_338;
  undefined1 local_315;
  int local_314;
  undefined8 *local_308;
  undefined1 local_2e5;
  int local_2e4;
  void **local_2e0;
  undefined8 *local_2d8;
  undefined1 local_2b5;
  int local_2b4;
  long *local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 *local_278;
  int local_1e4;
  undefined8 *local_1e0;
  int local_1d4;
  undefined8 *local_1d0;
  int local_1c4;
  undefined8 *local_1c0;
  long local_1b8;
  undefined4 local_1ac;
  long local_1a8;
  undefined4 *local_1a0;
  undefined4 local_194;
  int local_190;
  int local_18c;
  undefined8 *local_188;
  void *local_168;
  undefined8 *local_150;
  long local_148;
  undefined4 local_13c;
  long local_138;
  undefined4 *local_130;
  undefined4 local_124;
  int local_120;
  int local_11c;
  undefined8 *local_118;
  void *local_f8;
  undefined8 *local_e0;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 *local_c0;
  undefined4 local_b4;
  int local_b0;
  int local_ac;
  undefined8 *local_a8;
  void *local_88;
  undefined8 *local_70;
  undefined4 local_64;
  long local_60;
  undefined4 local_54;
  long local_50;
  undefined4 local_44;
  long local_40;
  undefined4 local_34;
  long local_30;
  undefined4 local_24;
  long local_20;
  undefined4 local_14;
  long local_10;
  
  _c = (int)((ulong)in_stack_fffffffffffff7c0 >> 0x20);
  local_4d4 = in_R8D * in_R9D;
  local_4c8 = in_ECX;
  local_4c4 = in_EDX;
  local_4c0 = in_RSI;
  Mat::reshape(in_stack_fffffffffffff8a8,(int)((ulong)in_stack_fffffffffffff8a0 >> 0x20),
               (int)in_stack_fffffffffffff8a0,(int)((ulong)in_stack_fffffffffffff898 >> 0x20),
               in_stack_fffffffffffff890);
  Mat::create(in_stack_fffffffffffff7d0,(int)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
              (int)in_stack_fffffffffffff7c8,_c,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0)
  ;
  for (local_530 = 0; local_530 + 0xf < local_4c8; local_530 = local_530 + 0x10) {
    local_2b4 = local_530 / 0x10;
    local_2a8 = &local_580;
    local_2b0 = local_4c0;
    local_18c = *(int *)((long)local_4c0 + 0x2c);
    local_190 = (int)local_4c0[6];
    local_194 = *(undefined4 *)((long)local_4c0 + 0x34);
    local_1a0 = (undefined4 *)(*local_4c0 + local_4c0[8] * (long)local_2b4 * local_4c0[2]);
    local_1a8 = local_4c0[2];
    local_1ac = (undefined4)local_4c0[3];
    local_1b8 = local_4c0[4];
    local_188 = &local_580;
    local_10 = (long)local_18c * (long)local_190 * local_1a8;
    local_14 = 0x10;
    local_2b5 = 1;
    local_278 = &local_580;
    local_4b0 = &local_580;
    local_580 = 0;
    local_570 = 0;
    local_568 = 0;
    local_558 = 0;
    local_554 = 0;
    local_550 = 0;
    local_54c = 0;
    local_548 = 0;
    local_540 = 0;
    local_578 = 0;
    local_538 = local_1a0;
    for (local_584 = 0; local_584 + 0xf < local_4c4; local_584 = local_584 + 0x10) {
      for (local_588 = 0; local_588 < local_4d4; local_588 = local_588 + 1) {
        for (local_58c = 0; local_58c < 0x10; local_58c = local_58c + 1) {
          for (local_590 = 0; local_590 < 0x10; local_590 = local_590 + 1) {
            local_2e4 = local_530 + local_590;
            local_2d8 = &local_5e0;
            local_2e0 = &local_520;
            local_168 = (void *)((long)local_520 + local_4e0 * local_2e4 * local_510);
            local_150 = &local_5e0;
            local_5c0 = local_500;
            local_20 = (long)local_4f4 * (long)local_4f0 * local_510;
            local_24 = 0x10;
            local_2e5 = 1;
            local_1c4 = local_584 + local_58c;
            local_1c0 = &local_5e0;
            local_598 = (void *)((long)local_168 + (long)local_4f4 * (long)local_1c4 * local_510);
            local_4a0 = &local_5e0;
            local_5e0 = 0;
            local_5d0 = 0;
            local_5c8 = 0;
            local_5b8 = 0;
            local_5b4 = 0;
            local_5b0 = 0;
            local_5ac = 0;
            local_5a8 = 0;
            local_5a0 = 0;
            local_5d8 = 0;
            *local_538 = *(undefined4 *)((long)local_598 + (long)local_588 * 4);
            local_538 = local_538 + 1;
            local_3d0 = local_4a0;
          }
        }
      }
    }
    local_3b0 = local_4b0;
    local_560 = local_1b8;
  }
  for (; local_530 + 7 < local_4c8; local_530 = local_530 + 8) {
    local_314 = local_530 / 0x10 +
                (int)((long)((ulong)(uint)((int)((long)local_530 % 0x10) >> 0x1f) << 0x20 |
                            (long)local_530 % 0x10 & 0xffffffffU) / 8);
    local_308 = &local_630;
    local_11c = *(int *)((long)local_4c0 + 0x2c);
    local_120 = (int)local_4c0[6];
    local_124 = *(undefined4 *)((long)local_4c0 + 0x34);
    local_130 = (undefined4 *)(*local_4c0 + local_4c0[8] * (long)local_314 * local_4c0[2]);
    local_138 = local_4c0[2];
    local_13c = (undefined4)local_4c0[3];
    local_148 = local_4c0[4];
    local_118 = &local_630;
    local_30 = (long)local_11c * (long)local_120 * local_138;
    local_280 = &local_630;
    local_498 = &local_630;
    local_34 = 0x10;
    local_315 = 1;
    local_630 = 0;
    local_620 = 0;
    local_618 = 0;
    local_608 = 0;
    local_604 = 0;
    local_600 = 0;
    local_5fc = 0;
    local_5f8 = 0;
    local_5f0 = 0;
    local_628 = 0;
    local_5e8 = local_130;
    for (local_634 = 0; local_634 + 0xf < local_4c4; local_634 = local_634 + 0x10) {
      for (local_638 = 0; local_638 < local_4d4; local_638 = local_638 + 1) {
        for (local_63c = 0; local_63c < 0x10; local_63c = local_63c + 1) {
          for (local_640 = 0; local_640 < 8; local_640 = local_640 + 1) {
            local_344 = local_530 + local_640;
            local_338 = &local_690;
            local_340 = &local_520;
            local_f8 = (void *)((long)local_520 + local_4e0 * local_344 * local_510);
            local_e0 = &local_690;
            local_670 = local_500;
            local_40 = (long)local_4f4 * (long)local_4f0 * local_510;
            local_44 = 0x10;
            local_345 = 1;
            local_1d4 = local_634 + local_63c;
            local_1d0 = &local_690;
            local_648 = (void *)((long)local_f8 + (long)local_4f4 * (long)local_1d4 * local_510);
            local_488 = &local_690;
            local_690 = 0;
            local_680 = 0;
            local_678 = 0;
            local_668 = 0;
            local_664 = 0;
            local_660 = 0;
            local_65c = 0;
            local_658 = 0;
            local_650 = 0;
            local_688 = 0;
            *local_5e8 = *(undefined4 *)((long)local_648 + (long)local_638 * 4);
            local_5e8 = local_5e8 + 1;
            local_400 = local_488;
          }
        }
      }
    }
    local_3e0 = local_498;
    local_610 = local_148;
  }
  for (; local_530 + 3 < local_4c8; local_530 = local_530 + 4) {
    local_374 = local_530 / 0x10 +
                (int)((long)((ulong)(uint)((int)((long)local_530 % 0x10) >> 0x1f) << 0x20 |
                            (long)local_530 % 0x10 & 0xffffffffU) / 8) +
                (int)((long)((ulong)(uint)((int)((long)local_530 % 8) >> 0x1f) << 0x20 |
                            (long)local_530 % 8 & 0xffffffffU) / 4);
    local_368 = &local_6e0;
    local_ac = *(int *)((long)local_4c0 + 0x2c);
    local_b0 = (int)local_4c0[6];
    local_b4 = *(undefined4 *)((long)local_4c0 + 0x34);
    local_c0 = (undefined4 *)(*local_4c0 + local_4c0[8] * (long)local_374 * local_4c0[2]);
    local_c8 = local_4c0[2];
    local_cc = (undefined4)local_4c0[3];
    local_d8 = local_4c0[4];
    local_a8 = &local_6e0;
    local_50 = (long)local_ac * (long)local_b0 * local_c8;
    local_288 = &local_6e0;
    local_480 = &local_6e0;
    local_54 = 0x10;
    local_375 = 1;
    local_6e0 = 0;
    local_6d0 = 0;
    local_6c8 = 0;
    local_6b8 = 0;
    local_6b4 = 0;
    local_6b0 = 0;
    local_6ac = 0;
    local_6a8 = 0;
    local_6a0 = 0;
    local_6d8 = 0;
    local_698 = local_c0;
    for (local_6e4 = 0; local_6e4 + 0xf < local_4c4; local_6e4 = local_6e4 + 0x10) {
      for (local_6e8 = 0; local_6e8 < local_4d4; local_6e8 = local_6e8 + 1) {
        for (local_6ec = 0; local_6ec < 0x10; local_6ec = local_6ec + 1) {
          for (local_6f0 = 0; local_6f0 < 4; local_6f0 = local_6f0 + 1) {
            local_3a4 = local_530 + local_6f0;
            local_398 = &local_740;
            local_3a0 = &local_520;
            local_88 = (void *)((long)local_520 + local_4e0 * local_3a4 * local_510);
            local_70 = &local_740;
            local_60 = (long)local_4f4 * (long)local_4f0 * local_510;
            local_1e4 = local_6e4 + local_6ec;
            local_1e0 = &local_740;
            local_6f8 = (void *)((long)local_88 + (long)local_4f4 * (long)local_1e4 * local_510);
            local_470 = &local_740;
            local_64 = 0x10;
            local_3a5 = 1;
            local_740 = 0;
            local_718 = 0;
            local_70c = 0;
            local_700 = 0;
            local_738 = 0;
            *local_698 = *(undefined4 *)((long)local_6f8 + (long)local_6e8 * 4);
            local_698 = local_698 + 1;
            local_430 = local_470;
          }
        }
      }
    }
    local_410 = local_480;
    local_6c0 = local_d8;
  }
  local_468 = &local_520;
  if (local_518 != (int *)0x0) {
    local_444 = 0xffffffff;
    LOCK();
    local_448 = *local_518;
    *local_518 = *local_518 + -1;
    UNLOCK();
    if (local_448 == 1) {
      local_440 = local_468;
      if (local_500 == (long *)0x0) {
        if (local_520 != (void *)0x0) {
          free(local_520);
        }
      }
      else {
        (**(code **)(*local_500 + 0x18))(local_500,local_520);
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 16b-16a-maxk-inch/16a-outch/8b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(16 * 16 * maxk, inch / 16, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4, (size_t)4u);

    int q = 0;
    for (; q + 15 < outch; q += 16)
    {
        float* g00 = kernel_tm.channel(q / 16);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 16; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
    for (; q + 7 < outch; q += 8)
    {
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
    for (; q + 3 < outch; q += 4)
    {
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8 + (q % 8) / 4);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}